

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test1D(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar9;
  long lVar8;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar7);
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar8 + 0x1440))(pEVar9,1,0x8229,8);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x502,"glTextureStorage1D",
                     "texture is not the name of an existing texture object.");
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar8 + 0x1440))(pEVar9,1,this->m_internalformat_invalid,8);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x500,"glTextureStorage1D",
                     "internalformat is not a valid sized internal format.");
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar8 + 0x1440))(pEVar9,1,0x8229,8);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x500,"glTextureStorage1D",
                     "the effective target of texture is not one of the accepted targets.");
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar8 + 0x1440))(pEVar9,0,0x8229,8);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x501,"glTextureStorage1D",
                     "levels is less than 1.");
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar8 + 0x1440))(pEVar9,1,0x8229,0);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x501,"glTextureStorage1D",
                     "width is less than 1.");
  pEVar9 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar8 + 0x1440))(pEVar9,8,0x8229,8);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar9,(this->super_TestCase).m_context,0x502,"glTextureStorage1D",
                     "levels is greater than log2(width)+1.");
  return (bVar6 && bVar5) && ((bVar4 && bVar3) && (bVar2 && bVar1));
}

Assistant:

bool StorageErrorsTest::Test1D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage1D if texture
	 is not the name of an existing texture object. */
	{
		gl.textureStorage1D(m_to_invalid, 1, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage1D",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage1D if
	 internalformat is not a valid sized internal format. */
	{
		gl.textureStorage1D(m_to_1D, 1, m_internalformat_invalid, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage1D",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage1D if target or
	 the effective target of texture is not one of the accepted targets
	 described above. */
	{
		gl.textureStorage1D(m_to_2D, 1, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage1D",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/*  Check that INVALID_VALUE is generated by TextureStorage1D if width or
	 levels are less than 1. */
	{
		gl.textureStorage1D(m_to_1D, 0, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage1D", "levels is less than 1.");

		gl.textureStorage1D(m_to_1D, 1, GL_R8, 0);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage1D", "width is less than 1.");
	}

	/*  Check that INVALID_OPERATION is generated by TextureStorage1D if levels
	 is greater than log2(width)+1. */
	{
		gl.textureStorage1D(m_to_1D, 8, GL_R8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage1D",
								  "levels is greater than log2(width)+1.");
	}

	return is_ok;
}